

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

format_arg * __thiscall
fmt::v6::internal::
specs_handler<fmt::v6::basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
::get_arg(format_arg *__return_storage_ptr__,
         specs_handler<fmt::v6::basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
         *this)

{
  uint uVar1;
  basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>
  *this_00;
  
  uVar1 = this->parse_context_->next_arg_id_;
  if (-1 < (int)uVar1) {
    this_00 = this->context_;
    this->parse_context_->next_arg_id_ = uVar1 + 1;
    get_arg<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>>,wchar_t>>
              (__return_storage_ptr__,(internal *)this_00,
               (basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>
                *)(ulong)uVar1,uVar1 + 1);
    return __return_storage_ptr__;
  }
  error_handler::on_error
            ((error_handler *)__return_storage_ptr__,
             "cannot switch from manual to automatic argument indexing");
}

Assistant:

FMT_CONSTEXPR format_arg get_arg(auto_id) {
    return internal::get_arg(context_, parse_context_.next_arg_id());
  }